

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O1

void summaryindex::doit(string *path,
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *eventtoperiods)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  FILE *pFVar5;
  _Rb_tree_node_base *p_Var6;
  undefined8 extraout_RAX;
  ulong uVar7;
  _Rb_tree_color _Var8;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_R8;
  _Base_ptr p_Var9;
  _Self __tmp;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summaryfileperiod_to_offset_00;
  pointer pbVar10;
  bool bVar11;
  string s2;
  string filename;
  string s3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summaryfileperiod_to_offset;
  string local_108;
  value_type local_e8;
  string *local_c8;
  string local_c0;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_80 [32];
  _Rb_tree_node_base *local_60;
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  summaryfileperiod_to_offset_00 =
       (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._24_8_ = local_80 + 8;
  local_80._8_4_ = _S_red;
  local_80._16_8_ = (_Base_ptr)0x0;
  local_58 = 0;
  local_c8 = path;
  local_a0 = eventtoperiods;
  local_60 = (_Rb_tree_node_base *)local_80._24_8_;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
LAB_001088a2:
    doit((summaryindex *)local_c8);
LAB_001088ac:
    doit((summaryindex *)&local_e8);
  }
  else {
    while( true ) {
      pdVar3 = readdir(__dirp);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      if (pdVar3 == (dirent *)0x0) break;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,pdVar3->d_name,pdVar3->d_name + sVar4);
      if (local_e8._M_string_length < 5) {
        bVar11 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_e8);
        iVar2 = std::__cxx11::string::compare((char *)local_50);
        bVar11 = iVar2 == 0;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      if (bVar11) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        pcVar1 = (local_c8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar1,pcVar1 + local_c8->_M_string_length);
        std::__cxx11::string::append((char *)&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_98,&local_e8);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,local_108._M_dataplus._M_p,
                   local_108._M_dataplus._M_p + local_108._M_string_length);
        uVar7 = local_108._M_string_length - 4;
        if (local_c0._M_string_length < uVar7) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
          ;
          goto LAB_001088a2;
        }
        local_c0._M_dataplus._M_p[uVar7] = '\0';
        local_c0._M_string_length = uVar7;
        std::__cxx11::string::append((char *)&local_c0);
        pFVar5 = fopen(local_c0._M_dataplus._M_p,"r");
        if (pFVar5 == (FILE *)0x0) {
          indexevents((summaryindex *)&local_108,(string *)local_80,summaryfileperiod_to_offset_00,
                      (int)local_a0,in_R8);
        }
        else {
          fclose(pFVar5);
          in_R8 = local_a0;
          indexevents(&local_108,&local_c0,
                      (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       *)local_80,(int)summaryfileperiod_to_offset_00,local_a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        summaryfileperiod_to_offset_00 =
             (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              *)(ulong)((int)summaryfileperiod_to_offset_00 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    pcVar1 = (local_c8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar1,pcVar1 + local_c8->_M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    pFVar5 = fopen(local_e8._M_dataplus._M_p,"wb");
    if (pFVar5 == (FILE *)0x0) goto LAB_001088ac;
    pbVar10 = local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fprintf(pFVar5,"%s\n",(pbVar10->_M_dataplus)._M_p);
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 !=
               local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fclose(pFVar5);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    pcVar1 = (local_c8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar1,pcVar1 + local_c8->_M_string_length);
    std::__cxx11::string::append((char *)&local_108);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    pFVar5 = fopen(local_e8._M_dataplus._M_p,"wb");
    if (pFVar5 != (FILE *)0x0) {
      if ((_Rb_tree_node_base *)local_80._24_8_ == (_Rb_tree_node_base *)(local_80 + 8)) {
        _Var8 = _S_red;
      }
      else {
        _Var8 = _S_red;
        p_Var6 = (_Rb_tree_node_base *)local_80._24_8_;
        do {
          if ((int)_Var8 < (int)p_Var6[1]._M_color) {
            _Var8 = p_Var6[1]._M_color;
          }
          for (p_Var9 = p_Var6[1]._M_left; p_Var9 != p_Var6[1]._M_right;
              p_Var9 = (_Base_ptr)&p_Var9->_M_parent) {
            fprintf(pFVar5,"%d, %d, %d, %lld\n",(ulong)p_Var6[1]._M_color,
                    (ulong)*(uint *)&p_Var6[1].field_0x4,(ulong)*(uint *)&p_Var6[1]._M_parent,
                    *(undefined8 *)p_Var9);
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)(local_80 + 8));
      }
      fclose(pFVar5);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      pcVar1 = (local_c8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar1,pcVar1 + local_c8->_M_string_length);
      std::__cxx11::string::append((char *)&local_108);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      pFVar5 = fopen(local_e8._M_dataplus._M_p,"wb");
      if (pFVar5 != (FILE *)0x0) {
        fprintf(pFVar5,"%d",(ulong)_Var8);
        fclose(pFVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        std::
        _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)local_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        return;
      }
      goto LAB_001088c0;
    }
  }
  doit((summaryindex *)&local_e8);
LAB_001088c0:
  doit((summaryindex *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void doit(const std::string& path, const std::map<int, std::vector<int>> &eventtoperiods)
{	
	std::vector<std::string> files;
	std::map<summary_period, std::vector<long long>> summaryfileperiod_to_offset;
	DIR* dir;
	struct dirent* ent;
	int file_index = 0;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				std::string s2 = path + ent->d_name;
				files.push_back(s);
				std::string s3 = s2;
				s3.erase(s2.length() - 4);
				s3 += ".idx";
				FILE * fidx = fopen(s3.c_str(), "r");
				if (fidx == nullptr) {
					indexevents(s2, summaryfileperiod_to_offset, file_index, eventtoperiods);
				} else {
					fclose(fidx);
					indexevents(s2, s3, summaryfileperiod_to_offset, file_index, eventtoperiods);
				}
				file_index++;
			}
		}
	}
	else {
		fprintf(stderr, "Unable to open directory %s\n", path.c_str());
		exit(-1);
	}

	std::string filename =  path + "filelist.idx";
	FILE* fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	auto iter = files.begin();
	while (iter != files.end()) {
		fprintf(fout, "%s\n", iter->c_str());
		iter++;
	}

	fclose(fout);

	int max_summary_id = 0;
	filename = path + "summaries.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	auto s_iter = summaryfileperiod_to_offset.begin();
	while (s_iter != summaryfileperiod_to_offset.end()) {
		if (s_iter->first.summary_id > max_summary_id) max_summary_id = s_iter->first.summary_id;
		auto v_iter = s_iter->second.begin();
		while (v_iter != s_iter->second.end()) {
			fprintf(fout, "%d, %d, %d, %lld\n", s_iter->first.summary_id, s_iter->first.fileindex, s_iter->first.period_no, *v_iter);
			v_iter++;
		}
		s_iter++;
	}
	fclose(fout);

	filename = path + "max_summary_id.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	fprintf(fout, "%d", max_summary_id);
	fclose(fout);
	
}